

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# file.cpp
# Opt level: O3

bool pbrt::WriteFile(string *filename,string *contents)

{
  int iVar1;
  string ret;
  ofstream out;
  string local_260;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_240;
  long local_220;
  filebuf local_218 [24];
  int aiStack_200 [54];
  ios_base local_128 [264];
  
  std::ofstream::ofstream((ostream *)&local_220,(string *)filename,_S_out);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&local_220,(contents->_M_dataplus)._M_p,contents->_M_string_length);
  std::ofstream::close();
  iVar1 = *(int *)((long)aiStack_200 + *(long *)(local_220 + -0x18));
  if (iVar1 != 0) {
    LastError();
    ErrorString_abi_cxx11_(0);
    local_260._M_string_length = 0;
    local_260.field_2._M_local_buf[0] = '\0';
    local_260._M_dataplus._M_p = (pointer)&local_260.field_2;
    detail::stringPrintfRecursive<std::__cxx11::string_const&,std::__cxx11::string>
              (&local_260,"%s: %s",filename,&local_240);
    Error((FileLoc *)0x0,local_260._M_dataplus._M_p);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_260._M_dataplus._M_p != &local_260.field_2) {
      operator_delete(local_260._M_dataplus._M_p,
                      CONCAT71(local_260.field_2._M_allocated_capacity._1_7_,
                               local_260.field_2._M_local_buf[0]) + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_240._M_dataplus._M_p != &local_240.field_2) {
      operator_delete(local_240._M_dataplus._M_p,local_240.field_2._M_allocated_capacity + 1);
    }
  }
  local_220 = _VTT;
  *(undefined8 *)(local_218 + *(long *)(_VTT + -0x18) + -8) = _begin;
  std::filebuf::~filebuf(local_218);
  std::ios_base::~ios_base(local_128);
  return iVar1 == 0;
}

Assistant:

bool WriteFile(const std::string &filename, const std::string &contents) {
    std::ofstream out(filename);
    out << contents;
    out.close();
    if (!out.good()) {
        Error("%s: %s", filename, ErrorString());
        return false;
    }
    return true;
}